

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestMacros.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_35ed9::TestFixturesWithThrowingDtorsAreFailures::RunImpl
          (TestFixturesWithThrowingDtorsAreFailures *this)

{
  TestResults *pTVar1;
  Test *pTVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  char *pcVar5;
  int failureCount;
  ScopedCurrentTest scopedResult;
  TestResults result;
  RecordingReporter reporter;
  int local_878;
  int local_874;
  TestDetails local_870;
  TestResults local_850;
  TestDetails local_838 [8];
  undefined1 local_72c;
  undefined4 local_62c;
  undefined1 local_628;
  undefined4 local_528;
  undefined1 local_524;
  undefined1 local_424;
  char local_324 [256];
  undefined4 local_224;
  undefined1 local_220;
  undefined1 local_120;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined4 local_10;
  
  pTVar2 = UnitTest::TestList::GetHead((TestList *)(anonymous_namespace)::throwingFixtureTestList2);
  if (pTVar2 == (Test *)0x0) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_838,*ppTVar4,0x90);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,local_838,"throwingFixtureTestList2.GetHead() != NULL");
  }
  local_838[0].suiteName = (char *)&PTR__TestReporter_00150810;
  local_838[0].testName._0_4_ = 0;
  local_62c = 0;
  local_528 = 0;
  local_224 = 0;
  local_838[0].testName._4_1_ = 0;
  local_72c = 0;
  local_628 = 0;
  local_524 = 0;
  local_424 = 0;
  local_324[0] = '\0';
  local_220 = 0;
  local_120 = 0;
  local_20 = 0;
  uStack_18 = 0;
  local_10 = 0;
  UnitTest::TestResults::TestResults(&local_850,(TestReporter *)local_838);
  ppTVar3 = UnitTest::CurrentTest::Results();
  local_870.suiteName = (char *)*ppTVar3;
  ppTVar4 = UnitTest::CurrentTest::Details();
  local_870.testName = (char *)*ppTVar4;
  ppTVar3 = UnitTest::CurrentTest::Results();
  *ppTVar3 = &local_850;
  pTVar2 = UnitTest::TestList::GetHead((TestList *)(anonymous_namespace)::throwingFixtureTestList2);
  UnitTest::Test::Run(pTVar2);
  ScopedCurrentTest::~ScopedCurrentTest((ScopedCurrentTest *)&local_870);
  local_874 = UnitTest::TestResults::GetFailedTestCount(&local_850);
  ppTVar3 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar3;
  local_878 = 1;
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_870,*ppTVar4,0x9a);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_878,&local_874,&local_870);
  pcVar5 = strstr(local_324,"while destroying fixture");
  if (pcVar5 == (char *)0x0) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_870,*ppTVar4,0x9b);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_870,"strstr(reporter.lastFailedMessage, \"while destroying fixture\")")
    ;
  }
  UnitTest::TestReporter::~TestReporter((TestReporter *)local_838);
  return;
}

Assistant:

TEST(FixturesWithThrowingDtorsAreFailures)
{
	CHECK(throwingFixtureTestList2.GetHead() != NULL);

	RecordingReporter reporter;
	TestResults result(&reporter);
	{
		ScopedCurrentTest scopedResult(result);
		throwingFixtureTestList2.GetHead()->Run();
	}

	int const failureCount = result.GetFailedTestCount();
	CHECK_EQUAL(1, failureCount);
	CHECK(strstr(reporter.lastFailedMessage, "while destroying fixture"));
}